

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O1

void __thiscall
asmjit::ZoneTree<asmjit::AddressTableEntry>::insert<asmjit::Support::Compare<0u>>
          (ZoneTree<asmjit::AddressTableEntry> *this,AddressTableEntry *node,Compare<0U> *cmp)

{
  uint *puVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  AddressTableEntry *pAVar6;
  ulong extraout_RAX;
  AddressTableEntry *pAVar7;
  AddressTableEntry *pAVar8;
  AddressTableEntry *pAVar9;
  byte *extraout_RDX;
  char *extraout_RDX_00;
  OffsetFormat *format;
  ulong uVar10;
  byte *pbVar11;
  uint uVar12;
  int iVar13;
  AddressTableEntry *pAVar14;
  ulong uVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  ulong *puVar19;
  uintptr_t uVar20;
  ZoneTreeNode *save;
  bool bVar21;
  ZoneTreeNode head;
  ulong uStack_80;
  uintptr_t local_48;
  AddressTableEntry *pAStack_40;
  
  uVar10 = (node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[0];
  if (uVar10 < 2) {
    if ((node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[1] ==
        0) {
      if (uVar10 == 0) {
        pAVar8 = this->_root;
        if (pAVar8 == (AddressTableEntry *)0x0) {
          this->_root = node;
        }
        else {
          pAVar6 = (AddressTableEntry *)&local_48;
          local_48 = 0;
          pAStack_40 = pAVar8;
          (node->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode._rbNodeData[0] =
               1;
          pAVar9 = (AddressTableEntry *)0x0;
          uVar10 = 0;
          pAVar14 = (AddressTableEntry *)0x0;
          uVar15 = 0;
          while( true ) {
            if (pAVar8 == (AddressTableEntry *)0x0) {
              (pAVar14->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
              _rbNodeData[uVar15] =
                   (ulong)((uint)(pAVar14->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                 super_ZoneTreeNode._rbNodeData[uVar15] & 1) | (ulong)node;
              pAVar7 = node;
            }
            else {
              uVar16 = (pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                       _rbNodeData[0];
              pbVar17 = (byte *)(uVar16 & 0xfffffffffffffffe);
              pAVar7 = pAVar8;
              if ((((pbVar17 != (byte *)0x0) && ((*pbVar17 & 1) != 0)) &&
                  (pbVar11 = (byte *)(pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                     super_ZoneTreeNode._rbNodeData[1], pbVar11 != (byte *)0x0)) &&
                 ((*pbVar11 & 1) != 0)) {
                (pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                _rbNodeData[0] = uVar16 | 1;
                *pbVar17 = *pbVar17 & 0xfe;
                puVar19 = (ulong *)(pAVar8->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                   super_ZoneTreeNode._rbNodeData[1];
                *puVar19 = *puVar19 & 0xfffffffffffffffe;
              }
            }
            if (((pAVar14 != (AddressTableEntry *)0x0) &&
                (((pAVar7->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                  _rbNodeData[0] & 1) != 0)) &&
               (((pAVar14->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                 _rbNodeData[0] & 1) != 0)) {
              bVar21 = pAVar9 == (AddressTableEntry *)
                                 (pAVar6->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                 super_ZoneTreeNode._rbNodeData[1];
              uVar18 = (ulong)(uVar10 == 0);
              bVar5 = uVar10 != 0;
              uVar16 = (pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                       _rbNodeData[bVar5];
              pbVar17 = (byte *)(uVar16 & 0xfffffffffffffffe);
              if (pAVar7 == (AddressTableEntry *)
                            ((pAVar14->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                             super_ZoneTreeNode._rbNodeData[uVar10] & 0xfffffffffffffffe)) {
                puVar19 = (ulong *)(pbVar17 + uVar18 * 8);
                uVar20 = (ulong)((uint)uVar16 & 1) | *puVar19 & 0xfffffffffffffffe;
              }
              else {
                pbVar11 = (byte *)(*(ulong *)(pbVar17 + (ulong)(uVar10 == 0) * 8) &
                                  0xfffffffffffffffe);
                uVar16 = (ulong)((uint)bVar5 * 8);
                *(ulong *)(pbVar17 + (ulong)(uVar10 == 0) * 8) =
                     (ulong)((uint)*(ulong *)(pbVar17 + (ulong)(uVar10 == 0) * 8) & 1) |
                     *(ulong *)(pbVar11 + uVar16) & 0xfffffffffffffffe;
                *(ulong *)(pbVar11 + uVar16) =
                     (ulong)((uint)*(undefined8 *)(pbVar11 + uVar16) & 1) | (ulong)pbVar17;
                *pbVar17 = *pbVar17 | 1;
                *pbVar11 = *pbVar11 & 0xfe;
                uVar10 = (ulong)((uint)*(undefined8 *)
                                        ((long)(pAVar9->
                                               super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                               super_ZoneTreeNode._rbNodeData + uVar16) & 1);
                *(byte **)((long)(pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                 super_ZoneTreeNode._rbNodeData + uVar16) = pbVar11 + uVar10;
                puVar19 = (ulong *)(pbVar11 + uVar18 * 8);
                uVar20 = *puVar19 & 0xfffffffffffffffe | uVar10;
                pbVar17 = pbVar11;
              }
              (pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
              _rbNodeData[bVar5] = uVar20;
              *puVar19 = (ulong)((uint)*puVar19 & 1) | (ulong)pAVar9;
              *(byte *)(pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                       _rbNodeData =
                   (byte)(pAVar9->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode
                         ._rbNodeData[0] | 1;
              *pbVar17 = *pbVar17 & 0xfe;
              (pAVar6->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
              _rbNodeData[bVar21] =
                   (ulong)((uint)(pAVar6->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                                 super_ZoneTreeNode._rbNodeData[bVar21] & 1) | (ulong)pbVar17;
            }
            if (pAVar7 == node) break;
            uVar16 = (ulong)(pAVar7->_address < node->_address);
            if (pAVar9 != (AddressTableEntry *)0x0) {
              pAVar6 = pAVar9;
            }
            pAVar8 = (AddressTableEntry *)
                     ((pAVar7->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                      _rbNodeData[uVar16] & 0xfffffffffffffffe);
            pAVar9 = pAVar14;
            uVar10 = uVar15;
            pAVar14 = pAVar7;
            uVar15 = uVar16;
          }
          this->_root = pAStack_40;
          *(byte *)(pAStack_40->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                   _rbNodeData =
               (byte)(pAStack_40->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode
                     ._rbNodeData[0] & 0xfe;
        }
        return;
      }
      goto LAB_00116034;
    }
  }
  else {
    insert<asmjit::Support::Compare<0u>>();
  }
  insert<asmjit::Support::Compare<0u>>();
LAB_00116034:
  insert<asmjit::Support::Compare<0u>>();
  bVar3 = extraout_RDX[5];
  if ((bVar3 == 0) || ((uint)extraout_RDX[3] * 8 < (uint)bVar3)) {
    return;
  }
  bVar4 = extraout_RDX[7];
  if (bVar4 != 0) {
    if (0x20 < bVar4) {
      CodeWriterUtils::encodeOffset32();
      bVar3 = extraout_RDX_00[5];
      if ((bVar3 != 0) && ((uint)bVar3 <= (uint)(byte)extraout_RDX_00[3] << 3)) {
        bVar4 = extraout_RDX_00[7];
        if (bVar4 != 0) {
          if (0x20 < bVar4) {
            CodeWriterUtils::encodeOffset64();
            if (format->_valueSize - 1 < 8) {
              uVar10 = (ulong)format->_valueOffset;
              uStack_80 = extraout_RAX;
              switch((uint)format->_valueSize) {
              case 1:
                bVar5 = CodeWriterUtils::encodeOffset32((uint32_t *)&uStack_80,(int64_t)node,format)
                ;
                if (bVar5) {
                  pbVar17 = (byte *)((long)&this->_root + uVar10);
                  *pbVar17 = *pbVar17 | (byte)uStack_80;
                }
                break;
              case 2:
                bVar5 = CodeWriterUtils::encodeOffset32((uint32_t *)&uStack_80,(int64_t)node,format)
                ;
                if (bVar5) {
                  puVar2 = (ushort *)((long)&this->_root + uVar10);
                  *puVar2 = *puVar2 | (ushort)uStack_80;
                }
                break;
              case 4:
                bVar5 = CodeWriterUtils::encodeOffset32((uint32_t *)&uStack_80,(int64_t)node,format)
                ;
                if (bVar5) {
                  puVar1 = (uint *)((long)&this->_root + uVar10);
                  *puVar1 = *puVar1 | (uint)uStack_80;
                }
                break;
              case 8:
                bVar5 = CodeWriterUtils::encodeOffset64(&uStack_80,(int64_t)node,format);
                if (bVar5) {
                  puVar19 = (ulong *)((long)&this->_root + uVar10);
                  *puVar19 = *puVar19 | uStack_80;
                }
              }
            }
            return;
          }
          if (((~(uint)(-1L << (bVar4 & 0x3f)) | 1) & (uint)node) != 0) {
            return;
          }
          node = (AddressTableEntry *)((long)node >> (bVar4 & 0x3f));
        }
        if (((AddressTableEntry *)(((long)node << (-bVar3 & 0x3f)) >> (-bVar3 & 0x3f)) == node) &&
           (*extraout_RDX_00 == '\0')) {
          this->_root = (AddressTableEntry *)
                        (((ulong)((long)node << (-bVar3 & 0x3f)) >> (-bVar3 & 0x3f)) <<
                        (extraout_RDX_00[6] & 0x3fU));
          return;
        }
      }
      return;
    }
    if (((~(uint)(-1L << (bVar4 & 0x3f)) | 1) & (uint)node) != 0) {
      return;
    }
    node = (AddressTableEntry *)((long)node >> (bVar4 & 0x3f));
  }
  uVar12 = (uint)node;
  if ((AddressTableEntry *)(long)(int)uVar12 != node) {
    return;
  }
  if ((int)(uVar12 << (-bVar3 & 0x1f)) >> (-bVar3 & 0x1f) == uVar12) {
    if (*extraout_RDX - 1 < 2) {
      if (extraout_RDX[6] != 5) {
        return;
      }
      if (bVar3 != 0x15) {
        return;
      }
      if (extraout_RDX[3] != 4) {
        return;
      }
      iVar13 = (uVar12 & 3) * 0x20000000 + (uVar12 & 0x1ffffc) * 8;
    }
    else {
      if (*extraout_RDX != 0) {
        return;
      }
      iVar13 = (uVar12 & ~(uint)(-1L << (bVar3 & 0x3f))) << (extraout_RDX[6] & 0x1f);
    }
    *(int *)&this->_root = iVar13;
    return;
  }
  return;
}

Assistant:

inline bool hasLeft() const noexcept { return _rbNodeData[0] > kRedMask; }